

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void cppcms::xss::anon_unknown_8::load_from_json(rules *r,value *v)

{
  key_type *__k;
  pointer ppVar1;
  bool bVar2;
  json_type jVar3;
  int iVar4;
  value *pvVar5;
  array *paVar6;
  pointer pvVar7;
  pointer pcVar8;
  value *this;
  const_iterator cVar9;
  long *plVar10;
  ostream *poVar11;
  runtime_error *prVar12;
  _Alloc_hider _Var13;
  size_type *psVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  data *pdVar17;
  string *property;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  string *tag_name;
  pair<std::_Rb_tree_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar21;
  validator_type validator;
  string type;
  value attrs_val;
  int pos2;
  int pos;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_new_pairs;
  regex rg;
  str_vec entities;
  ostringstream ss;
  string encoding;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_tags_attrs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_tags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  rules *local_3f0;
  value local_3e8;
  undefined4 local_3e0;
  undefined4 local_3dc;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  char *local_3b8;
  ulong local_3b0;
  regex local_3a8 [8];
  _Any_data local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368 [5];
  array *local_1f0;
  string local_1e8 [2];
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178 [6];
  
  local_3dc = 0xffffffff;
  local_3e0 = 0xffffffff;
  local_368[0].first._M_dataplus._M_p._0_1_ = 1;
  bVar2 = json::value::get<bool>(v,"xhtml",(bool *)local_368);
  ((r->d).ptr_)->is_xhtml = bVar2;
  local_368[0].first._M_dataplus._M_p._0_1_ = 0;
  bVar2 = json::value::get<bool>(v,"comments",(bool *)local_368);
  ((r->d).ptr_)->comments_allowed = bVar2;
  local_368[0].first._M_dataplus._M_p =
       (pointer)((ulong)local_368[0].first._M_dataplus._M_p._1_7_ << 8);
  bVar2 = json::value::get<bool>(v,"numeric_entities",(bool *)local_368);
  ((r->d).ptr_)->numeric_entities_allowed = bVar2;
  local_368[0].first._M_dataplus._M_p = (pointer)0x0;
  local_368[0].first._M_string_length = 0;
  local_368[0].first.field_2._M_allocated_capacity = (code *)0x0;
  json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_380,v,"entities",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_368);
  if (local_380.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_380.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar18 = 0;
    uVar20 = 0;
    do {
      pdVar17 = (r->d).ptr_;
      if (pdVar17->is_xhtml == false) {
        pdVar17 = (data *)&pdVar17->html_rules;
      }
      basic_rules_holder::add_entity
                ((basic_rules_holder *)pdVar17,
                 (string *)
                 ((long)&((local_380.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18));
      uVar20 = uVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (uVar20 < (ulong)((long)local_380.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_380.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  json::value::get_abi_cxx11_(local_1e8,v,"encoding","");
  if (local_1e8[0]._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&((r->d).ptr_)->encoding);
  }
  local_178[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178[0]._M_impl.super__Rb_tree_header._M_header;
  local_178[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
  local_178[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"opening_and_closing","");
  load_tags_from_json(r,v,&local_368[0].first,opening_and_closing,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
    operator_delete(local_368[0].first._M_dataplus._M_p);
  }
  local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"stand_alone","");
  load_tags_from_json(r,v,&local_368[0].first,stand_alone,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
    operator_delete(local_368[0].first._M_dataplus._M_p);
  }
  local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"any_tag","");
  load_tags_from_json(r,v,&local_368[0].first,any_tag,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
    operator_delete(local_368[0].first._M_dataplus._M_p);
  }
  pvVar5 = json::value::find(v,"attributes");
  json::value::copyable::copyable(&local_3e8.d,&pvVar5->d);
  bVar2 = json::value::is_undefined(&local_3e8);
  if (!bVar2) {
    jVar3 = json::value::type(&local_3e8);
    if (jVar3 != is_array) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_368,"xss::rules: attributes is expected to be an array","");
      booster::runtime_error::runtime_error(prVar12,&local_368[0].first);
      *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
      (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_3f0 = r;
    paVar6 = json::value::array(&local_3e8);
    local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8._M_impl.super__Rb_tree_header._M_header;
    local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    pvVar7 = (paVar6->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((paVar6->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
        _M_impl.super__Vector_impl_data._M_finish != pvVar7) {
      uVar20 = 0;
      local_1f0 = paVar6;
      do {
        local_3dc = (undefined4)uVar20;
        local_3b0 = uVar20;
        jVar3 = json::value::type(pvVar7 + uVar20);
        if (jVar3 != is_object) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,
                     "xss::rules: attributes is expected to be an array of objects","");
          booster::runtime_error::runtime_error(prVar12,&local_368[0].first);
          *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
          (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3d8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar5 = (paVar6->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_3b0;
        local_368[0].first.field_2._M_allocated_capacity = 0;
        local_368[0].first._M_dataplus._M_p = (pointer)0x0;
        local_368[0].first._M_string_length = 0;
        json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_410,pvVar5,"tags",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_368);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_368);
        local_368[0].first._M_dataplus._M_p = (pointer)0x0;
        local_368[0].first._M_string_length = 0;
        local_368[0].first.field_2._M_allocated_capacity = (code *)0x0;
        json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_438,pvVar5,"attributes",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_368);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_368);
        if ((pointer)local_410._M_string_length != local_410._M_dataplus._M_p) {
          uVar20 = 0;
          pcVar8 = (pointer)local_438._M_string_length;
          _Var13._M_p = local_410._M_dataplus._M_p;
          _Var15._M_p = local_438._M_dataplus._M_p;
          pcVar19 = (char *)local_410._M_string_length;
          do {
            bVar2 = pcVar8 != _Var15._M_p;
            pcVar8 = _Var15._M_p;
            if (bVar2) {
              lVar18 = 0;
              uVar16 = 0;
              do {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (local_368,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_410._M_dataplus._M_p + uVar20 * 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (_Var15._M_p + lVar18));
                std::
                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)&local_3d8,local_368);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368[0].second._M_dataplus._M_p != &local_368[0].second.field_2) {
                  operator_delete(local_368[0].second._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
                  operator_delete(local_368[0].first._M_dataplus._M_p);
                }
                uVar16 = uVar16 + 1;
                lVar18 = lVar18 + 0x20;
                pcVar8 = (pointer)local_438._M_string_length;
                _Var13._M_p = local_410._M_dataplus._M_p;
                _Var15._M_p = local_438._M_dataplus._M_p;
                pcVar19 = (char *)local_410._M_string_length;
              } while (uVar16 < (ulong)((long)(local_438._M_string_length -
                                              (long)local_438._M_dataplus._M_p) >> 5));
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < (ulong)((long)pcVar19 - (long)_Var13._M_p >> 5));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_410);
        this = json::value::find(pvVar5,"pairs");
        bVar2 = json::value::is_undefined(this);
        if (!bVar2) {
          jVar3 = json::value::type(this);
          if (jVar3 != is_array) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_368,"xss::rules: invalid object type for attributes[",0x2f);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_368);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"].pairs",7);
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::stringbuf::str();
            booster::runtime_error::runtime_error(prVar12,&local_410);
            *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
            (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
            __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
          }
          paVar6 = json::value::array(this);
          pvVar7 = (paVar6->
                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((paVar6->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
              )._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
            lVar18 = 0;
            uVar20 = 0;
            do {
              local_3e0 = (undefined4)uVar20;
              json::value::get<std::__cxx11::string>
                        (&local_410,(value *)((long)&(pvVar7->d).d.ptr_ + lVar18),"tag");
              json::value::get<std::__cxx11::string>
                        (&local_438,
                         (value *)((long)&(((paVar6->
                                            super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->d).d.ptr_ +
                                  lVar18),"attr");
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (local_368,&local_410,&local_438);
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_3d8,local_368);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368[0].second._M_dataplus._M_p != &local_368[0].second.field_2) {
                operator_delete(local_368[0].second._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
                operator_delete(local_368[0].first._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != &local_410.field_2) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              uVar20 = uVar20 + 1;
              pvVar7 = (paVar6->
                       super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar18 = lVar18 + 8;
            } while (uVar20 < (ulong)((long)(paVar6->
                                            super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar7 >> 3));
          }
        }
        if (local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_368,"xss::rules: no tags/attributes defined in attributes","");
          booster::runtime_error::runtime_error(prVar12,&local_368[0].first);
          *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
          (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        json::value::get<std::__cxx11::string>(&local_410,pvVar5,"type");
        if (local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar18 = 0;
          uVar20 = 0;
          do {
            ppVar1 = local_3d8.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __k = (key_type *)
                  ((long)&((local_3d8.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                  lVar18);
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(local_178,__k);
            if ((_Rb_tree_header *)cVar9._M_node == &local_178[0]._M_impl.super__Rb_tree_header) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
              std::operator+(&local_438,"xss::rules: tags ",__k);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_438);
              local_368[0].first._M_dataplus._M_p = (pointer)*plVar10;
              psVar14 = (size_type *)(plVar10 + 2);
              if ((size_type *)local_368[0].first._M_dataplus._M_p == psVar14) {
                local_368[0].first.field_2._0_8_ = *psVar14;
                local_368[0].first.field_2._8_8_ = plVar10[3];
                local_368[0].first._M_dataplus._M_p = (pointer)&local_368[0].first.field_2;
              }
              else {
                local_368[0].first.field_2._0_8_ = *psVar14;
              }
              local_368[0].first._M_string_length = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              booster::runtime_error::runtime_error(prVar12,&local_368[0].first);
              *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
              (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868
              ;
              __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            pVar21 = std::
                     _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                     ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
                               ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                 *)&local_1a8,
                                (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)((long)&((local_3d8.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + lVar18));
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3a0,"xss::rules: duplicate tag/attribute pair: ",__k);
              plVar10 = (long *)std::__cxx11::string::append(local_3a0._M_pod_data);
              local_438._M_dataplus._M_p = (pointer)*plVar10;
              psVar14 = (size_type *)(plVar10 + 2);
              if ((size_type *)local_438._M_dataplus._M_p == psVar14) {
                local_438.field_2._M_allocated_capacity = *psVar14;
                local_438.field_2._8_8_ = plVar10[3];
                local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
              }
              else {
                local_438.field_2._M_allocated_capacity = *psVar14;
              }
              local_438._M_string_length = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::operator+(&local_368[0].first,&local_438,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&(ppVar1->second)._M_dataplus._M_p + lVar18));
              booster::runtime_error::runtime_error(prVar12,&local_368[0].first);
              *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
              (prVar12->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868
              ;
              __cxa_throw(prVar12,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            uVar20 = uVar20 + 1;
            lVar18 = lVar18 + 0x40;
          } while (uVar20 < (ulong)((long)local_3d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 6));
        }
        booster::regex::regex(local_3a8);
        local_438.field_2._M_allocated_capacity = 0;
        local_438.field_2._8_8_ = 0;
        local_438._M_dataplus._M_p = (pointer)0x0;
        local_438._M_string_length = 0;
        iVar4 = std::__cxx11::string::compare((char *)&local_410);
        pcVar19 = "attributes[{1}].type";
        if (iVar4 == 0) {
          json::value::get<std::__cxx11::string>(&local_368[0].first,pvVar5,"expression");
          booster::regex::regex((regex *)local_3a0._M_pod_data,(string *)local_368,0);
          booster::regex::operator=(local_3a8,(regex *)local_3a0._M_pod_data);
          booster::regex::~regex((regex *)local_3a0._M_pod_data);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
            operator_delete(local_368[0].first._M_dataplus._M_p);
          }
          pcVar19 = "attributes[{1}].expression";
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_410);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_410), iVar4 == 0))
        {
          iVar4 = std::__cxx11::string::compare((char *)&local_410);
          local_3a0._M_unused._M_object = &local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3a0,"(http|https|ftp|mailto|news|nntp)","");
          json::value::get<std::__cxx11::string>
                    (&local_368[0].first,pvVar5,"scheme",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a0
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_unused._0_8_ != &local_390) {
            operator_delete(local_3a0._M_unused._M_object);
          }
          rules::uri_validator((validator_type *)&local_3a0,&local_368[0].first,iVar4 != 0);
          std::function<bool_(const_char_*,_const_char_*)>::operator=
                    ((function<bool_(const_char_*,_const_char_*)> *)&local_438,
                     (function<bool_(const_char_*,_const_char_*)> *)&local_3a0);
          if ((code *)local_390._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_390._M_allocated_capacity)(&local_3a0,&local_3a0,3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368[0].first._M_dataplus._M_p != &local_368[0].first.field_2) {
            operator_delete(local_368[0].first._M_dataplus._M_p);
          }
          pcVar19 = "attributes[{1}].scheme";
        }
        local_3b8 = pcVar19;
        if (local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_3d8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar18 = 0x20;
          uVar20 = 0;
          do {
            tag_name = (string *)
                       ((long)local_3d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar18 + -0x20);
            property = (string *)
                       ((long)&((local_3d8.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p
                       + lVar18);
            iVar4 = std::__cxx11::string::compare((char *)&local_410);
            if (iVar4 == 0) {
              rules::add_boolean_property(local_3f0,tag_name,property);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_410);
              if (iVar4 == 0) {
                rules::add_integer_property(local_3f0,tag_name,property);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_410);
                if (iVar4 == 0) {
                  rules::relative_uri_validator();
                  pdVar17 = (local_3f0->d).ptr_;
                  if (pdVar17->is_xhtml == false) {
                    pdVar17 = (data *)&pdVar17->html_rules;
                  }
                  (*(pdVar17->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder[1])
                            (pdVar17,tag_name,property,local_368);
                  if ((code *)local_368[0].first.field_2._0_8_ != (code *)0x0) {
                    (*(code *)local_368[0].first.field_2._0_8_)(local_368,local_368,3);
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_410);
                  if (iVar4 == 0) {
                    rules::add_property(local_3f0,tag_name,property,local_3a8);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_410);
                    if ((iVar4 != 0) &&
                       (iVar4 = std::__cxx11::string::compare((char *)&local_410), iVar4 != 0)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_368,"xss::rules: invalid attributes[",0x1f);
                      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_368);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"].type=",7);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_410._M_dataplus._M_p,local_410._M_string_length);
                      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
                      std::__cxx11::stringbuf::str();
                      booster::runtime_error::runtime_error(prVar12,(string *)&local_3a0);
                      *(undefined ***)prVar12 = &PTR__runtime_error_00284840;
                      (prVar12->super_backtrace)._vptr_backtrace =
                           (_func_int **)&PTR__cppcms_error_00284868;
                      __cxa_throw(prVar12,&cppcms_error::typeinfo,
                                  booster::runtime_error::~runtime_error);
                    }
                    pdVar17 = (local_3f0->d).ptr_;
                    if (pdVar17->is_xhtml == false) {
                      pdVar17 = (data *)&pdVar17->html_rules;
                    }
                    (*(pdVar17->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder[1])
                              (pdVar17,tag_name,property,&local_438);
                  }
                }
              }
            }
            uVar20 = uVar20 + 1;
            lVar18 = lVar18 + 0x40;
          } while (uVar20 < (ulong)((long)local_3d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 6));
        }
        if ((code *)local_438.field_2._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_438.field_2._M_allocated_capacity)(&local_438,&local_438,3);
        }
        booster::regex::~regex(local_3a8);
        paVar6 = local_1f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_3d8);
        uVar20 = local_3b0 + 1;
        pvVar7 = (paVar6->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar20 < (ulong)((long)(paVar6->
                                      super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >>
                               3));
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1a8);
  }
  json::value::copyable::~copyable(&local_3e8.d);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8[0]._M_dataplus._M_p != &local_1e8[0].field_2) {
    operator_delete(local_1e8[0]._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380);
  return;
}

Assistant:

void load_from_json(rules &r,json::value const &v)
		{
			char const *last="";
			int pos = -1,pos2=-1;
			try {
				last="xhtml";
				r.html(v.get("xhtml",true) ? rules::xhtml_input : rules::html_input);
				last="comments";
				r.comments_allowed(v.get("comments",false));
				last="numeric_entities";
				r.numeric_entities_allowed(v.get("numeric_entities",false));
				typedef std::vector<std::string> str_vec;
				last="entities";
				str_vec entities = v.get("entities",str_vec());
				for(size_t i=0;i<entities.size();i++) {
					r.add_entity(entities[i]);
				}
				last="encoding";
				std::string encoding = v.get("encoding","");
				if(!encoding.empty()) {
					r.encoding(encoding);
				}
				std::set<std::string> all_tags;
				last="tags.opening_and_closing";
				load_tags_from_json(r,v,"opening_and_closing",rules::opening_and_closing,all_tags);
				last="tags.stand_alone";
				load_tags_from_json(r,v,"stand_alone",rules::stand_alone,all_tags);
				last="tags.any_tag";
				load_tags_from_json(r,v,"any_tag",rules::any_tag,all_tags);
				json::value attrs_val = v.find("attributes");
				if(attrs_val.is_undefined())
					return;
				if(attrs_val.type()!=json::is_array) {
					throw cppcms_error("xss::rules: attributes is expected to be an array");
				}
				json::array const &attributes = attrs_val.array();
				std::set<std::pair<std::string,std::string> > all_tags_attrs;
				for(size_t i=0;i< attributes.size();i++) {
					pos = i;
					if(attributes[i].type()!=json::is_object) {
						throw cppcms_error("xss::rules: attributes is expected to be an array of objects");
					}
					std::vector<std::pair<std::string,std::string> > all_new_pairs;

					json::value const &attr = attributes[i];

					{ // add tags/attr
						last="attributes[{1}].tags";
						str_vec tags = attr.get("tags",str_vec());
						last="attributes[{1}].attributes";
						str_vec names = attr.get("attributes",str_vec());
						for(size_t j=0;j<tags.size();j++) 
							for(size_t k=0;k<names.size();k++)
								all_new_pairs.push_back(std::make_pair(tags[j],names[k]));
					}
		
					{ // add pairs
						json::value const &pairs = attr.find("pairs");
						if(!pairs.is_undefined()) {
							if(pairs.type()!=json::is_array) {
								std::ostringstream ss;
								ss << "xss::rules: invalid object type for attributes[" 
									<< i <<"].pairs";
								throw cppcms_error(ss.str());
							}
							json::array const &ar=pairs.array();
							for(size_t j=0;j<ar.size();j++) {
								pos2=j;
								last="attributes[{1}].pairs[{2}].tag";
								std::string tag=ar[j].get<std::string>("tag");
								last="attributes[{1}].pairs[{2}].attr";
								std::string attr=ar[j].get<std::string>("attr");
								all_new_pairs.push_back(std::make_pair(tag,attr));
							}
						}
					}

					if(all_new_pairs.empty()) {
						throw cppcms_error("xss::rules: no tags/attributes defined in attributes");
					}

					last="attributes[{1}].type";
					std::string type = attr.get<std::string>("type");

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag=all_new_pairs[j].first;
						std::string const &attr=all_new_pairs[j].second;
						if(all_tags.count(tag)!=1)
							throw cppcms_error("xss::rules: tags " + tag 
									+ " enlisted in attributes set"
									"is not defined in tags part");
						if(all_tags_attrs.insert(all_new_pairs[j]).second == false) 
							throw cppcms_error("xss::rules: duplicate tag/attribute pair: " 
									+ tag + ":" + attr);
					}
					
					booster::regex rg;
					rules::validator_type validator;
					
					if(type == "regex") {
						last="attributes[{1}].expression";
						rg = booster::regex(attr.get<std::string>("expression"));
					}

					if(type=="uri" || type=="absolute_uri") {
						bool absolute_only = type != "uri";
						last="attributes[{1}].scheme";
						std::string scheme = attr.get<std::string>("scheme",basic_allowed_schemes);
						validator = rules::uri_validator(scheme,absolute_only);
					}

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag  =all_new_pairs[j].first;
						std::string const &attr =all_new_pairs[j].second;

						if(type == "boolean")
							r.add_boolean_property(tag,attr);
						else if(type == "integer")
							r.add_integer_property(tag,attr);
						else if(type == "relative_uri") 
							r.add_property(tag,attr,rules::relative_uri_validator());
						else if(type == "regex") 
							r.add_property(tag,attr,rg);
						else if(type == "uri" || type == "absolute_uri") 
							r.add_property(tag,attr,validator);
						else {
							std::ostringstream ss;
							ss <<"xss::rules: invalid attributes[" << i << "].type="<<type;
							throw cppcms_error(ss.str());
						}
					}
				} // for attributes
			}
			catch(json::bad_value_cast const &) {
				std::ostringstream ss;
				ss << "xss::rules:invalid type for "
				   << booster::locale::format(last) % pos % pos2;
				throw cppcms_error(ss.str());
			}
		}